

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fStencilTexturingTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::UploadTex2DArrayCase::iterate(UploadTex2DArrayCase *this)

{
  glBindTextureFunc p_Var1;
  glBindRenderbufferFunc p_Var2;
  glBindFramebufferFunc p_Var3;
  glFramebufferRenderbufferFunc p_Var4;
  int iVar5;
  deUint32 dVar6;
  GLenum err;
  RenderContext *context;
  undefined4 extraout_var;
  TestLog *pTVar7;
  char *description;
  int local_2fc;
  ConstPixelBufferAccess local_2f8;
  ConstPixelBufferAccess local_2d0;
  ConstPixelBufferAccess local_2a8;
  PixelBufferAccess local_280;
  TextureFormat local_258;
  undefined1 local_250 [8];
  TextureLevel reference;
  bool local_1f9;
  undefined1 local_1f8 [7];
  bool levelOk;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  string local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  ScopedLogSection local_178;
  ScopedLogSection section;
  int levelNdx_1;
  bool allLevelsOk;
  undefined1 local_160 [8];
  TextureLevel readLevel;
  PixelBufferAccess local_110;
  undefined1 local_e8 [8];
  PixelBufferAccess levelAccess;
  TextureFormat TStack_b8;
  int levelNdx;
  undefined1 local_b0 [8];
  TextureLevel uploadLevel;
  Texture depthStencilTex;
  undefined1 local_60 [8];
  Renderbuffer colorBuf;
  Framebuffer fbo;
  int ptrnLevel;
  int levels;
  int height;
  int width;
  Functions *gl;
  RenderContext *renderCtx;
  UploadTex2DArrayCase *this_local;
  Functions *gl_00;
  
  context = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar5 = (*context->_vptr_RenderContext[3])();
  gl_00 = (Functions *)CONCAT44(extraout_var,iVar5);
  glu::TypedObjectWrapper<(glu::ObjectType)3>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)3> *)&colorBuf.super_ObjectWrapper.m_object,
             context);
  glu::TypedObjectWrapper<(glu::ObjectType)2>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)2> *)local_60,context);
  glu::TypedObjectWrapper<(glu::ObjectType)0>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)0> *)&uploadLevel.m_data.m_cap,context);
  TStack_b8 = glu::mapGLInternalFormat(this->m_format);
  tcu::TextureLevel::TextureLevel((TextureLevel *)local_b0,&stack0xffffffffffffff48,0x29,0xd,7);
  checkDepthStencilFormatSupport((this->super_TestCase).m_context,this->m_format);
  for (levelAccess.super_ConstPixelBufferAccess.m_data._4_4_ = 0;
      levelAccess.super_ConstPixelBufferAccess.m_data._4_4_ < 7;
      levelAccess.super_ConstPixelBufferAccess.m_data._4_4_ =
           levelAccess.super_ConstPixelBufferAccess.m_data._4_4_ + 1) {
    tcu::TextureLevel::getAccess(&local_110,(TextureLevel *)local_b0);
    tcu::getSubregion((PixelBufferAccess *)local_e8,&local_110,0,0,
                      levelAccess.super_ConstPixelBufferAccess.m_data._4_4_,0x29,0xd,1);
    if (levelAccess.super_ConstPixelBufferAccess.m_data._4_4_ == 3) {
      renderTestPatternReference((PixelBufferAccess *)local_e8);
    }
    else {
      tcu::clearStencil((PixelBufferAccess *)local_e8,
                        levelAccess.super_ConstPixelBufferAccess.m_data._4_4_);
    }
  }
  p_Var1 = gl_00->bindTexture;
  dVar6 = glu::ObjectWrapper::operator*((ObjectWrapper *)&uploadLevel.m_data.m_cap);
  (*p_Var1)(0x8c1a,dVar6);
  (*gl_00->texStorage3D)(0x8c1a,1,this->m_format,0x29,0xd,7);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            ((ConstPixelBufferAccess *)&readLevel.m_data.m_cap,(TextureLevel *)local_b0);
  glu::texSubImage3D(context,0x8c1a,0,0,0,0,(ConstPixelBufferAccess *)&readLevel.m_data.m_cap);
  err = (*gl_00->getError)();
  glu::checkError(err,"Uploading texture data failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fStencilTexturingTests.cpp"
                  ,0x25e);
  p_Var2 = gl_00->bindRenderbuffer;
  dVar6 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_60);
  (*p_Var2)(0x8d41,dVar6);
  (*gl_00->renderbufferStorage)(0x8d41,0x8236,0x29,0xd);
  p_Var3 = gl_00->bindFramebuffer;
  dVar6 = glu::ObjectWrapper::operator*((ObjectWrapper *)&colorBuf.super_ObjectWrapper.m_object);
  (*p_Var3)(0x8d40,dVar6);
  p_Var4 = gl_00->framebufferRenderbuffer;
  dVar6 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_60);
  (*p_Var4)(0x8d40,0x8ce0,0x8d41,dVar6);
  checkFramebufferStatus(gl_00);
  tcu::TextureFormat::TextureFormat((TextureFormat *)&levelNdx_1,RGBA,UNSIGNED_INT32);
  tcu::TextureLevel::TextureLevel((TextureLevel *)local_160,(TextureFormat *)&levelNdx_1,0x29,0xd,1)
  ;
  section.m_log._7_1_ = 1;
  for (section.m_log._0_4_ = 0; (int)section.m_log < 7; section.m_log._0_4_ = (int)section.m_log + 1
      ) {
    pTVar7 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    de::toString<int>(&local_1b8,(int *)&section);
    std::operator+(&local_198,"Level",&local_1b8);
    de::toString<int>((string *)local_1f8,(int *)&section);
    std::operator+(&local_1d8,"Level ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8);
    tcu::ScopedLogSection::ScopedLogSection(&local_178,pTVar7,&local_198,&local_1d8);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)local_1f8);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::~string((string *)&local_1b8);
    dVar6 = glu::ObjectWrapper::operator*((ObjectWrapper *)&uploadLevel.m_data.m_cap);
    blitStencilToColor2DArray(context,dVar6,0x29,0xd,(int)section.m_log);
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)&reference.m_data.m_cap,(TextureLevel *)local_160);
    glu::readPixels(context,0,0,(PixelBufferAccess *)&reference.m_data.m_cap);
    if ((int)section.m_log == 3) {
      tcu::TextureFormat::TextureFormat(&local_258,S,UNSIGNED_INT8);
      tcu::TextureLevel::TextureLevel((TextureLevel *)local_250,&local_258,0x29,0xd,1);
      tcu::PixelBufferAccess::PixelBufferAccess(&local_280,(TextureLevel *)local_250);
      renderTestPatternReference(&local_280);
      pTVar7 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_2a8,(TextureLevel *)local_250);
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_2d0,(TextureLevel *)local_160);
      local_1f9 = compareStencilToRed(pTVar7,&local_2a8,&local_2d0);
      tcu::TextureLevel::~TextureLevel((TextureLevel *)local_250);
    }
    else {
      pTVar7 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_2f8,(TextureLevel *)local_160);
      local_1f9 = compareRedChannel(pTVar7,&local_2f8,(int)section.m_log);
    }
    if (local_1f9 == false) {
      section.m_log._7_1_ = 0;
      local_2fc = 5;
    }
    else {
      local_2fc = 0;
    }
    tcu::ScopedLogSection::~ScopedLogSection(&local_178);
    if (local_2fc != 0) break;
  }
  description = "Image comparison failed";
  if ((section.m_log._7_1_ & 1) != 0) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
             (byte)~section.m_log._7_1_ & QP_TEST_RESULT_FAIL,description);
  tcu::TextureLevel::~TextureLevel((TextureLevel *)local_160);
  tcu::TextureLevel::~TextureLevel((TextureLevel *)local_b0);
  glu::TypedObjectWrapper<(glu::ObjectType)0>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)0> *)&uploadLevel.m_data.m_cap);
  glu::TypedObjectWrapper<(glu::ObjectType)2>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)2> *)local_60);
  glu::TypedObjectWrapper<(glu::ObjectType)3>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)3> *)&colorBuf.super_ObjectWrapper.m_object);
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		const glu::RenderContext&	renderCtx			= m_context.getRenderContext();
		const glw::Functions&		gl					= renderCtx.getFunctions();
		const int					width				= 41;
		const int					height				= 13;
		const int					levels				= 7;
		const int					ptrnLevel			= 3;
		glu::Framebuffer			fbo					(renderCtx);
		glu::Renderbuffer			colorBuf			(renderCtx);
		glu::Texture				depthStencilTex		(renderCtx);
		TextureLevel				uploadLevel			(glu::mapGLInternalFormat(m_format), width, height, levels);

		checkDepthStencilFormatSupport(m_context, m_format);

		for (int levelNdx = 0; levelNdx < levels; levelNdx++)
		{
			const tcu::PixelBufferAccess levelAccess = tcu::getSubregion(uploadLevel.getAccess(), 0, 0, levelNdx, width, height, 1);

			if (levelNdx == ptrnLevel)
				renderTestPatternReference(levelAccess);
			else
				tcu::clearStencil(levelAccess, levelNdx);
		}

		gl.bindTexture(GL_TEXTURE_2D_ARRAY, *depthStencilTex);
		gl.texStorage3D(GL_TEXTURE_2D_ARRAY, 1, m_format, width, height, levels);
		glu::texSubImage3D(renderCtx, GL_TEXTURE_2D_ARRAY, 0, 0, 0, 0, uploadLevel);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Uploading texture data failed");

		gl.bindRenderbuffer(GL_RENDERBUFFER, *colorBuf);
		gl.renderbufferStorage(GL_RENDERBUFFER, GL_R32UI, width, height);

		gl.bindFramebuffer(GL_FRAMEBUFFER, *fbo);
		gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, *colorBuf);
		checkFramebufferStatus(gl);

		{
			TextureLevel	readLevel		(TextureFormat(TextureFormat::RGBA, TextureFormat::UNSIGNED_INT32), width, height);
			bool			allLevelsOk		= true;

			for (int levelNdx = 0; levelNdx < levels; levelNdx++)
			{
				tcu::ScopedLogSection section(m_testCtx.getLog(), "Level" + de::toString(levelNdx), "Level " + de::toString(levelNdx));
				bool levelOk;

				blitStencilToColor2DArray(renderCtx, *depthStencilTex, width, height, levelNdx);
				glu::readPixels(renderCtx, 0, 0, readLevel);

				if (levelNdx == ptrnLevel)
				{
					TextureLevel reference(TextureFormat(TextureFormat::S, TextureFormat::UNSIGNED_INT8), width, height);
					renderTestPatternReference(reference);

					levelOk = compareStencilToRed(m_testCtx.getLog(), reference, readLevel);
				}
				else
					levelOk = compareRedChannel(m_testCtx.getLog(), readLevel, levelNdx);

				if (!levelOk)
				{
					allLevelsOk = false;
					break;
				}
			}

			m_testCtx.setTestResult(allLevelsOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
									allLevelsOk ? "Pass"				: "Image comparison failed");
		}

		return STOP;
	}